

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

u_char * pcap_next(pcap_t *p,pcap_pkthdr *h)

{
  int iVar1;
  undefined1 local_40 [8];
  u_char *pkt;
  oneshot_userdata s;
  pcap_pkthdr *h_local;
  pcap_t *p_local;
  
  s.hdr = (pcap_pkthdr *)local_40;
  pkt = (u_char *)h;
  s.pkt = (u_char **)p;
  s.pd = (pcap_t *)h;
  iVar1 = pcap_dispatch(p,1,p->oneshot_callback,(u_char *)&pkt);
  if (iVar1 < 1) {
    p_local = (pcap_t *)0x0;
  }
  else {
    p_local = (pcap_t *)local_40;
  }
  return (u_char *)p_local;
}

Assistant:

const u_char *
pcap_next(pcap_t *p, struct pcap_pkthdr *h)
{
	struct oneshot_userdata s;
	const u_char *pkt;

	s.hdr = h;
	s.pkt = &pkt;
	s.pd = p;
	if (pcap_dispatch(p, 1, p->oneshot_callback, (u_char *)&s) <= 0)
		return (0);
	return (pkt);
}